

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O3

int4 __thiscall Varnode::termOrder(Varnode *this,Varnode *op)

{
  uint uVar1;
  pointer ppVVar2;
  AddrSpace *pAVar3;
  AddrSpace *pAVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = op->flags;
  if ((this->flags & 2) == 0) {
    if ((uVar1 & 2) != 0) {
      return -1;
    }
    if ((((this->flags & 0x10) != 0) && (this->def->opcode->opcode == CPUI_INT_MULT)) &&
       (ppVVar2 = (this->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, (ppVVar2[1]->flags & 2) != 0)) {
      this = *ppVVar2;
    }
    if ((((uVar1 & 0x10) != 0) && (op->def->opcode->opcode == CPUI_INT_MULT)) &&
       (ppVVar2 = (op->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, (ppVVar2[1]->flags & 2) != 0)) {
      op = *ppVVar2;
    }
    pAVar3 = (this->loc).base;
    pAVar4 = (op->loc).base;
    if (pAVar3 == pAVar4) {
      uVar5 = (this->loc).offset;
      uVar6 = (op->loc).offset;
      if (uVar5 < uVar6) {
        return -1;
      }
      if (uVar6 < uVar5) {
        return 1;
      }
    }
    else {
      if (pAVar3 == (AddrSpace *)0x0) {
        return -1;
      }
      if (pAVar3 != (AddrSpace *)0xffffffffffffffff) {
        if (pAVar4 == (AddrSpace *)0xffffffffffffffff) {
          return -1;
        }
        if (pAVar4 == (AddrSpace *)0x0) {
          return 1;
        }
        if (pAVar3->index < pAVar4->index) {
          return -1;
        }
      }
      if (pAVar4 != (AddrSpace *)0xffffffffffffffff) {
        if (pAVar4 == (AddrSpace *)0x0) {
          return 1;
        }
        if (pAVar3 == (AddrSpace *)0xffffffffffffffff) {
          return 1;
        }
        if (pAVar4->index < pAVar3->index) {
          return 1;
        }
      }
    }
  }
  else if ((uVar1 & 2) == 0) {
    return 1;
  }
  return 0;
}

Assistant:

bool isConstant(void) const { return ((flags&Varnode::constant)!=0); }